

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O1

void __thiscall UDPSocket::setMTUDiscovery(UDPSocket *this,IP_PMTUDISC_ENUM e)

{
  ulong uVar1;
  int iVar2;
  ulong in_RAX;
  string *__return_storage_ptr__;
  uint v;
  undefined8 uStack_18;
  
  uStack_18._0_4_ = (undefined4)in_RAX;
  uVar1 = in_RAX;
  switch(e) {
  case WANT:
    uStack_18 = CONCAT44(1,(undefined4)uStack_18);
    uVar1 = uStack_18;
    break;
  case DONT:
    uStack_18 = in_RAX & 0xffffffff;
    uVar1 = uStack_18;
    break;
  case DO:
    uStack_18 = CONCAT44(2,(undefined4)uStack_18);
    uVar1 = uStack_18;
    break;
  case PROBE:
    uStack_18 = CONCAT44(3,(undefined4)uStack_18);
    uVar1 = uStack_18;
  }
  uStack_18 = uVar1;
  iVar2 = setsockopt((this->super_Socket).sockfd,0,10,(void *)((long)&uStack_18 + 4),4);
  if (iVar2 < 0) {
    __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
    sock_error_string_abi_cxx11_(__return_storage_ptr__,"UDPSocket::setMTUDiscovery()");
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  return;
}

Assistant:

void UDPSocket::setMTUDiscovery(enum IP_PMTUDISC_ENUM e) {
  unsigned int v;
  unsigned int l = sizeof(v);
  switch (e) {
  case WANT:
#ifdef _WIN32
    return;
#else
    v = IP_PMTUDISC_WANT;
    break;
#endif
  case DONT:
    v = IP_PMTUDISC_DONT;
    break;
  case DO:
    v = IP_PMTUDISC_DO;
    break;
  case PROBE:
    v = IP_PMTUDISC_PROBE;
  }
  if (setsockopt(sockfd, IPPROTO_IP, IP_MTU_DISCOVER, (char *)&v, l) < 0) {
    throw sock_error_string("UDPSocket::setMTUDiscovery()");
  }
}